

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

int Curl_cpool_init(cpool *cpool,Curl_cpool_disconnect_cb *disconnect_cb,Curl_multi *multi,
                   Curl_share *share,size_t size)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  CURL *pCVar3;
  int iVar4;
  
  Curl_hash_init(&cpool->dest2bundle,size,Curl_hash_str,Curl_str_key_compare,cpool_bundle_free_entry
                );
  Curl_llist_init(&cpool->shutdowns,(Curl_llist_dtor)0x0);
  iVar4 = 1;
  if (disconnect_cb != (Curl_cpool_disconnect_cb *)0x0) {
    pCVar3 = curl_easy_init();
    cpool->idata = pCVar3;
    if (pCVar3 != (CURL *)0x0) {
      puVar1 = &(pCVar3->state).field_0x776;
      *puVar1 = *puVar1 | 4;
      pCVar2 = cpool->idata;
      pCVar2->multi = multi;
      cpool->disconnect_cb = disconnect_cb;
      cpool->multi = multi;
      pCVar2->multi = multi;
      cpool->share = share;
      pCVar2->share = share;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Curl_cpool_init(struct cpool *cpool,
                        Curl_cpool_disconnect_cb *disconnect_cb,
                        struct Curl_multi *multi,
                        struct Curl_share *share,
                        size_t size)
{
  DEBUGASSERT(!!multi != !!share); /* either one */
  Curl_hash_init(&cpool->dest2bundle, size, Curl_hash_str,
                 Curl_str_key_compare, cpool_bundle_free_entry);
  Curl_llist_init(&cpool->shutdowns, NULL);

  DEBUGASSERT(disconnect_cb);
  if(!disconnect_cb)
    return 1;

  /* allocate a new easy handle to use when closing cached connections */
  cpool->idata = curl_easy_init();
  if(!cpool->idata)
    return 1; /* bad */
  cpool->idata->state.internal = TRUE;
  /* TODO: this is quirky. We need an internal handle for certain
   * operations, but we do not add it to the multi (if there is one).
   * But we give it the multi so that socket event operations can work.
   * Probably better to have an internal handle owned by the multi that
   * can be used for cpool operations. */
  cpool->idata->multi = multi;
 #ifdef DEBUGBUILD
  if(getenv("CURL_DEBUG"))
    cpool->idata->set.verbose = TRUE;
#endif

  cpool->disconnect_cb = disconnect_cb;
  cpool->idata->multi = cpool->multi = multi;
  cpool->idata->share = cpool->share = share;

  return 0; /* good */
}